

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::check_module_collision(CTcMake *this,CTcMakeModule *new_mod)

{
  CTcMain *this_00;
  int iVar1;
  tcmod_source_t tVar2;
  textchar_t *ptVar3;
  char *__format;
  textchar_t *ptVar4;
  CTcMakeModule *in_RSI;
  long in_RDI;
  char new_name_buf [8202];
  char *cur_root;
  CTcMakeModule *cur_mod;
  char *new_root;
  char *in_stack_ffffffffffffdf78;
  char *in_stack_ffffffffffffdf80;
  char local_2038 [112];
  CTcMakeModule *local_20;
  
  CTcMakeModule::get_source_name((CTcMakeModule *)0x207281);
  os_get_root_name(in_stack_ffffffffffffdf80);
  local_20 = *(CTcMakeModule **)(in_RDI + 0x30);
  while( true ) {
    if (local_20 == (CTcMakeModule *)0x0 || local_20 == in_RSI) {
      return;
    }
    CTcMakeModule::get_source_name((CTcMakeModule *)0x2072e7);
    os_get_root_name(in_stack_ffffffffffffdf80);
    iVar1 = stricmp(in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf78);
    if (iVar1 == 0) break;
    local_20 = CTcMakeModule::get_next(local_20);
  }
  tVar2 = CTcMakeModule::get_source_type(in_RSI);
  if (tVar2 == TCMOD_SOURCE_NORMAL) {
    ptVar3 = CTcMakeModule::get_source_name((CTcMakeModule *)0x20733e);
    sprintf(local_2038,"\"%s\"",ptVar3);
  }
  else {
    __format = tcerr_get_msg((int)((ulong)in_stack_ffffffffffffdf78 >> 0x20),
                             (int)in_stack_ffffffffffffdf78);
    ptVar3 = CTcMakeModule::get_source_name((CTcMakeModule *)0x20737e);
    ptVar4 = CTcMakeModule::get_from_lib((CTcMakeModule *)0x207390);
    sprintf(local_2038,__format,ptVar3,ptVar4);
  }
  tVar2 = CTcMakeModule::get_source_type(local_20);
  this_00 = G_tcmain;
  if (tVar2 == TCMOD_SOURCE_NORMAL) {
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x296f,local_2038);
    return;
  }
  ptVar3 = CTcMakeModule::get_from_lib((CTcMakeModule *)0x20740b);
  CTcMain::log_error(this_00,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2970,local_2038,ptVar3);
  return;
}

Assistant:

void CTcMake::check_module_collision(CTcMakeModule *new_mod)
{
    const char *new_root;
    CTcMakeModule *cur_mod;

    /* get the root name of this module */
    new_root = os_get_root_name((char *)new_mod->get_source_name());

    /* 
     *   Scan the list of modules for a collision.  Stop when we get to this
     *   module, because we want to report the collision at the later module,
     *   so that we report basically in the order of adding modules to the
     *   build.  
     */
    for (cur_mod = mod_head_ ; cur_mod != 0 && cur_mod != new_mod ;
         cur_mod = cur_mod->get_next())
    {
        const char *cur_root;

        /* 
         *   Compare this module's root name.  Since some file systems are
         *   insensitive to case, ignore case ourselves; this is more
         *   restrictive than is actually necessary on some systems, but will
         *   flag the potential for problems in case the project is later
         *   moved to a different operating system.  
         */
        cur_root = os_get_root_name((char *)cur_mod->get_source_name());
        if (stricmp(cur_root, new_root) == 0)
        {
            char new_name_buf[OSFNMAX*2 + 10];

            /* if the new module is from a library, so note */
            if (new_mod->get_source_type() == TCMOD_SOURCE_NORMAL)
            {
                /* it's not from a library - just show the module name */
                sprintf(new_name_buf, "\"%s\"", new_mod->get_source_name());
            }
            else
            {
                /* it is from a library - show the library name as well */
                sprintf(new_name_buf,
                        tcerr_get_msg(TCERR_SOURCE_FROM_LIB, FALSE),
                        new_mod->get_source_name(), new_mod->get_from_lib());
            }

            /*
             *   Flag a warning.  If the older module is from a library, use
             *   a separate version of the message, so that we can mention
             *   the library it's from.  
             */
            if (cur_mod->get_source_type() == TCMOD_SOURCE_NORMAL)
            {
                /* the older module isn't from a library */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MODULE_NAME_COLLISION,
                                    new_name_buf);
            }
            else
            {
                /* the older module is in a library, so mention the source */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MODULE_NAME_COLLISION_WITH_LIB,
                                    new_name_buf, cur_mod->get_from_lib());
            }

            /* 
             *   there's no need to find yet another module with the same
             *   name - it's good enough to flag the error once 
             */
            break;
        }
    }
}